

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  string *__rhs;
  cmSourceFile **sf;
  _Alloc_hider _Var6;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  allocator<char> local_49;
  string local_48;
  
  pcVar1 = this->GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"ghs_integrity_app",&local_49);
  pcVar5 = cmGeneratorTarget::GetProperty(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (pcVar5 == (char *)0x0) {
    local_48.field_2._M_allocated_capacity = 0;
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    cmGeneratorTarget::GetSourceFiles
              (this->GeneratorTarget,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48,
               &this->ConfigName);
    sVar2 = local_48._M_string_length;
    _Var6._M_p = local_48._M_dataplus._M_p;
    do {
      bVar3 = _Var6._M_p != (pointer)sVar2;
      if (_Var6._M_p == (pointer)sVar2) break;
      __rhs = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var6._M_p);
      bVar4 = std::operator==("int",__rhs);
      _Var6._M_p = _Var6._M_p + 8;
    } while (!bVar4);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48);
  }
  else {
    pcVar1 = this->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"ghs_integrity_app",&local_49);
    pcVar5 = cmGeneratorTarget::GetProperty(pcVar1,&local_48);
    bVar3 = cmSystemTools::IsOn(pcVar5);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar3;
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  const char* p = this->GeneratorTarget->GetProperty("ghs_integrity_app");
  if (p) {
    return cmSystemTools::IsOn(
      this->GeneratorTarget->GetProperty("ghs_integrity_app"));
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  for (auto& sf : sources) {
    if ("int" == sf->GetExtension()) {
      return true;
    }
  }
  return false;
}